

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O3

void __thiscall
duckdb::SetColumnCommentInfo::Serialize(SetColumnCommentInfo *this,Serializer *serializer)

{
  AlterInfo::Serialize(&this->super_AlterInfo,serializer);
  (*serializer->_vptr_Serializer[2])(serializer,300,"catalog_entry_type");
  Serializer::WriteValue<duckdb::CatalogType>(serializer,(this->super_AlterInfo).field_0x71);
  (*serializer->_vptr_Serializer[3])(serializer);
  Serializer::WriteProperty<duckdb::Value>(serializer,0x12d,"comment_value",&this->comment_value);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (serializer,0x12e,"column_name",&this->column_name);
  return;
}

Assistant:

void SetColumnCommentInfo::Serialize(Serializer &serializer) const {
	AlterInfo::Serialize(serializer);
	serializer.WriteProperty<CatalogType>(300, "catalog_entry_type", catalog_entry_type);
	serializer.WriteProperty<Value>(301, "comment_value", comment_value);
	serializer.WritePropertyWithDefault<string>(302, "column_name", column_name);
}